

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O1

void TryAllocMightFail(size_t size)

{
  code *pcVar1;
  size_t i;
  long lVar2;
  code *pcVar3;
  code *local_20;
  
  local_20 = malloc;
  (*noopt_helper)(&local_20);
  pcVar1 = (code *)(*local_20)(size);
  if (pcVar1 != (code *)0x0) {
    lVar2 = 0;
    pcVar3 = pcVar1;
    do {
      *pcVar3 = SUB81(lVar2,0);
      lVar2 = lVar2 + 1;
      pcVar3 = pcVar3 + (size >> 10);
    } while (lVar2 != 0x400);
    lVar2 = 0;
    pcVar3 = pcVar1;
    do {
      if (SUB81(lVar2,0) != *pcVar3) {
        syscall(1,2,"Check failed: p[i * (size / kPoints)] == static_cast<unsigned char>(i)\n",0x47)
        ;
        abort();
      }
      lVar2 = lVar2 + 1;
      pcVar3 = pcVar3 + (size >> 10);
    } while (lVar2 != 0x400);
    pcVar1[size - 1] = (code)0x4d;
  }
  local_20 = pcVar1;
  (*noopt_helper)(&local_20);
  free(local_20);
  return;
}

Assistant:

void TryAllocMightFail(size_t size) {
  unsigned char* p = static_cast<unsigned char*>(noopt(malloc)(size));
  if (p != nullptr) {
    static const size_t kPoints = 1024;

    for ( size_t i = 0; i < kPoints; ++i ) {
      p[i * (size / kPoints)] = static_cast<unsigned char>(i);
    }

    for ( size_t i = 0; i < kPoints; ++i ) {
      CHECK(p[i * (size / kPoints)] == static_cast<unsigned char>(i));
    }

    p[size-1] = 'M';
    CHECK(p[size-1] == 'M');
  }

  free(noopt(p));
}